

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O3

rfc5444_result cb_tlv_packet(rfc5444_reader_tlvblock_entry *tlv,rfc5444_reader_tlvblock_context *c)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = c->consumer->order;
  uVar3 = (ulong)tlv->type;
  printf("%s: packet tlv %d (order %d): %d\n","cb_tlv_packet",uVar3,(ulong)uVar1,
         (ulong)(uint)callback_index);
  iVar2 = callback_index + 1;
  *(int *)((long)(int)uVar1 * 8 + 0x1144f4 + uVar3 * 4) = callback_index;
  callback_index = iVar2;
  return *(rfc5444_result *)((long)(int)uVar1 * 8 + 0x114504 + uVar3 * 4);
}

Assistant:

static enum rfc5444_result
cb_tlv_packet(struct rfc5444_reader_tlvblock_entry *tlv,
    struct rfc5444_reader_tlvblock_context *c) {
  int oi = c->consumer->order - 1;
  int ti = tlv->type - 1;

#ifdef PRINT_CB
  printf("%s: packet tlv %d (order %d): %d\n",
      __func__, tlv->type, c->consumer->order, callback_index);
#endif
  idxcb_tlv_packet[oi][ti] = callback_index++;
  return result_tlv_packet[oi][ti];
}